

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

_Bool ray_intersect_aabb(vec3 ro,vec3 rd,vec3 aabb_min,vec3 aabb_max,float *t)

{
  float fVar1;
  float local_c8;
  float temp_2;
  float tzmax;
  float tzmin;
  float temp_1;
  float tymax;
  float tymin;
  float temp;
  float tmax;
  float tmin;
  vec3 max;
  vec3 min;
  float *t_local;
  vec3 aabb_max_local;
  vec3 aabb_min_local;
  float local_38;
  float fStack_34;
  vec3 rd_local;
  float local_18;
  float fStack_14;
  vec3 ro_local;
  
  max.y = aabb_min.x;
  local_18 = ro.x;
  local_38 = rd.x;
  temp = (max.y - local_18) / local_38;
  tmax = aabb_max.x;
  local_38 = (tmax - local_18) / local_38;
  tymin = local_38;
  if (local_38 < temp) {
    tymin = temp;
    temp = local_38;
  }
  max.z = aabb_min.y;
  fStack_14 = ro.y;
  fStack_34 = rd.y;
  temp_1 = (max.z - fStack_14) / fStack_34;
  tmin = aabb_max.y;
  fStack_34 = (tmin - fStack_14) / fStack_34;
  tzmin = fStack_34;
  if (fStack_34 < temp_1) {
    tzmin = temp_1;
    temp_1 = fStack_34;
  }
  if ((tzmin < temp) || (tymin < temp_1)) {
    ro_local.y._3_1_ = false;
  }
  else {
    if (temp < temp_1) {
      temp = temp_1;
    }
    if (tzmin < tymin) {
      tymin = tzmin;
    }
    temp_2 = (aabb_min.z - ro.z) / rd.z;
    fVar1 = (aabb_max.z - ro.z) / rd.z;
    local_c8 = fVar1;
    if (fVar1 < temp_2) {
      local_c8 = temp_2;
      temp_2 = fVar1;
    }
    if ((local_c8 < temp) || (tymin < temp_2)) {
      ro_local.y._3_1_ = false;
    }
    else {
      if (temp < temp_2) {
        temp = temp_2;
      }
      *t = temp;
      ro_local.y._3_1_ = true;
    }
  }
  return ro_local.y._3_1_;
}

Assistant:

bool ray_intersect_aabb(vec3 ro, vec3 rd, vec3 aabb_min, vec3 aabb_max, float *t) {
    vec3 min = aabb_min;
    vec3 max = aabb_max;

    float tmin = (min.x - ro.x) / rd.x;
    float tmax = (max.x - ro.x) / rd.x;

    if (tmin > tmax) {
        float temp = tmin;
        tmin = tmax;
        tmax = temp;
    }

    float tymin = (min.y - ro.y) / rd.y;
    float tymax = (max.y - ro.y) / rd.y;

    if (tymin > tymax) {
        float temp = tymin;
        tymin = tymax;
        tymax = temp;
    }

    if ((tmin > tymax) || (tymin > tmax))
        return false;

    if (tymin > tmin)
        tmin = tymin;

    if (tymax < tmax)
        tmax = tymax;

    float tzmin = (min.z - ro.z) / rd.z;
    float tzmax = (max.z - ro.z) / rd.z;

    if (tzmin > tzmax) {
        float temp = tzmin;
        tzmin = tzmax;
        tzmax = temp;
    }

    if ((tmin > tzmax) || (tzmin > tmax))
        return false;

    if (tzmin > tmin)
        tmin = tzmin;

    if (tzmax < tmax)
        tmax = tzmax;

    *t = tmin;

    return true;
}